

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

rb_result_t rb_tree_empty(rb_tree *tree,int *is_empty)

{
  rb_result_t ret;
  int *is_empty_local;
  rb_tree *tree_local;
  
  if (tree == (rb_tree *)0x0) {
    __assert_fail("\"tree != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x75,"rb_result_t rb_tree_empty(struct rb_tree *, int *)");
  }
  if (is_empty == (int *)0x0) {
    __assert_fail("\"is_empty != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x76,"rb_result_t rb_tree_empty(struct rb_tree *, int *)");
  }
  *is_empty = (uint)(tree->root == (rb_tree_node *)0x0);
  return 0;
}

Assistant:

rb_result_t rb_tree_empty(struct rb_tree *tree,
                          int *is_empty)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(is_empty != NULL);

    *is_empty = !!(tree->root == NULL);

    return ret;
}